

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O0

qint64 __thiscall QNetworkReplyFileImpl::bytesAvailable(QNetworkReplyFileImpl *this)

{
  bool bVar1;
  QNetworkReplyFileImplPrivate *pQVar2;
  ulong uVar3;
  qint64 qVar4;
  long lVar5;
  QFile *pQVar6;
  long lVar7;
  QNetworkReplyFileImplPrivate *d;
  
  pQVar2 = d_func((QNetworkReplyFileImpl *)0x1e761c);
  if ((((pQVar2->super_QNetworkReplyPrivate).isFinished & 1U) != 0) &&
     (bVar1 = QPointer::operator_cast_to_bool((QPointer<QFile> *)0x1e7640), bVar1)) {
    QPointer<QFile>::operator->((QPointer<QFile> *)0x1e7657);
    uVar3 = QIODevice::isOpen();
    if ((uVar3 & 1) != 0) {
      lVar5 = QIODevice::bytesAvailable();
      pQVar6 = QPointer<QFile>::operator->((QPointer<QFile> *)0x1e7693);
      lVar7 = (**(code **)(*(long *)pQVar6 + 0xa0))();
      return lVar5 + lVar7;
    }
  }
  qVar4 = QIODevice::bytesAvailable();
  return qVar4;
}

Assistant:

qint64 QNetworkReplyFileImpl::bytesAvailable() const
{
    Q_D(const QNetworkReplyFileImpl);
    if (!d->isFinished || !d->realFile || !d->realFile->isOpen())
        return QNetworkReply::bytesAvailable();
    return QNetworkReply::bytesAvailable() + d->realFile->bytesAvailable();
}